

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  char *digits;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_t __len;
  char *pcVar7;
  unsigned_long __n2;
  
  sVar2 = *(size_t *)(this + 8);
  if (sVar2 != 0) {
    pcVar7 = *it;
    memmove(pcVar7,*(void **)this,sVar2);
    *it = pcVar7 + sVar2;
  }
  pcVar5 = *it;
  sVar2 = *(size_t *)(this + 0x18);
  pcVar7 = pcVar5;
  if (sVar2 != 0) {
    pcVar7 = pcVar5 + sVar2;
    memset(pcVar5,*(int *)(this + 0x10),sVar2);
  }
  *it = pcVar7;
  uVar1 = *(uint *)(this + 0x28);
  pcVar4 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x14) == 'x') {
    pcVar4 = "0123456789abcdef";
  }
  pcVar5 = pcVar5 + sVar2 + uVar1;
  uVar6 = *(ulong *)(*(long *)(this + 0x20) + 0x10);
  do {
    pcVar5 = pcVar5 + -1;
    *pcVar5 = pcVar4[(uint)uVar6 & 0xf];
    bVar3 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar3);
  *it = pcVar7 + uVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }